

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

bool absl::StrContainsIgnoreCase(string_view haystack,char needle)

{
  string_view haystack_00;
  char cVar1;
  char cVar2;
  size_type sVar3;
  uchar in_DL;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  char *in_RDI;
  char both_cstr [3];
  char lower_needle;
  char upper_needle;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined5 in_stack_ffffffffffffffe0;
  char cVar4;
  undefined1 local_1;
  
  cVar1 = ascii_toupper(in_DL);
  cVar4 = cVar1;
  cVar2 = ascii_tolower(in_DL);
  haystack_00._M_len._3_1_ = cVar2;
  haystack_00._M_len._0_3_ = (int3)in_stack_ffffffffffffffc8;
  if (cVar4 == cVar2) {
    haystack_00._M_len._4_1_ = cVar1;
    haystack_00._M_len._5_1_ = in_stack_ffffffffffffffcd;
    haystack_00._M_len._6_1_ = in_stack_ffffffffffffffce;
    haystack_00._M_len._7_1_ = in_stack_ffffffffffffffcf;
    haystack_00._M_str = in_RDI;
    local_1 = StrContains(haystack_00,'\0');
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (in_RSI,in_RDI,
                       CONCAT17(in_DL,CONCAT16(cVar4,CONCAT15(cVar2,in_stack_ffffffffffffffe0))));
    local_1 = sVar3 != 0xffffffffffffffff;
  }
  return local_1;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           char needle) noexcept {
  char upper_needle = absl::ascii_toupper(static_cast<unsigned char>(needle));
  char lower_needle = absl::ascii_tolower(static_cast<unsigned char>(needle));
  if (upper_needle == lower_needle) {
    return StrContains(haystack, needle);
  } else {
    const char both_cstr[3] = {lower_needle, upper_needle, '\0'};
    return haystack.find_first_of(both_cstr) != absl::string_view::npos;
  }
}